

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O2

bool __thiscall
draco::RAnsSymbolDecoder<14>::Create(RAnsSymbolDecoder<14> *this,DecoderBuffer *buffer)

{
  ushort uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint8_t prob_data;
  uint8_t eb;
  undefined8 uStack_38;
  
  uVar1 = buffer->bitstream_version_;
  uStack_38 = (ulong)uVar1;
  if (uVar1 == 0) {
    return false;
  }
  if (uVar1 < 0x200) {
    bVar3 = DecoderBuffer::Decode<unsigned_int>(buffer,&this->num_symbols_);
  }
  else {
    bVar3 = DecodeVarint<unsigned_int>(&this->num_symbols_,buffer);
  }
  if ((bVar3 == false) ||
     (buffer->data_size_ - buffer->pos_ < (long)(ulong)(this->num_symbols_ >> 6))) {
LAB_0016ddeb:
    bVar3 = false;
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->probability_table_,(ulong)this->num_symbols_);
    uVar5 = this->num_symbols_;
    if (uVar5 == 0) {
      bVar3 = true;
    }
    else {
      uVar9 = 0;
      while (uVar9 < uVar5) {
        uStack_38._0_7_ = (uint7)(uint6)uStack_38;
        bVar3 = DecoderBuffer::Decode<unsigned_char>(buffer,(uchar *)((long)&uStack_38 + 6));
        if (!bVar3) goto LAB_0016ddeb;
        uVar5 = (uint)uStack_38._6_1_;
        uVar6 = (ulong)(uStack_38._6_1_ >> 2);
        if ((uVar5 & 3) == 3) {
          uVar4 = (uStack_38._6_1_ >> 2) + uVar9;
          if (this->num_symbols_ <= uVar4) goto LAB_0016ddeb;
          puVar2 = (this->probability_table_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = uVar6 + 1;
          while (bVar3 = lVar7 != 0, lVar7 = lVar7 + -1, bVar3) {
            puVar2[uVar9] = 0;
            uVar9 = uVar9 + 1;
          }
        }
        else {
          for (iVar8 = 0; (uVar5 & 3) << 3 != iVar8; iVar8 = iVar8 + 8) {
            bVar3 = DecoderBuffer::Decode<unsigned_char>(buffer,(uchar *)((long)&uStack_38 + 7));
            if (!bVar3) goto LAB_0016ddeb;
            uVar6 = (ulong)((uint)uVar6 | (uint)uStack_38._7_1_ << ((char)iVar8 + 6U & 0x1f));
          }
          (this->probability_table_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9] = (uint)uVar6;
          uVar4 = uVar9;
        }
        uVar5 = this->num_symbols_;
        uVar9 = uVar4 + 1;
      }
      bVar3 = RAnsDecoder<20>::rans_build_look_up_table
                        (&this->ans_,
                         (this->probability_table_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar5);
    }
  }
  return bVar3;
}

Assistant:

uint16_t bitstream_version() const { return bitstream_version_; }